

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

Node * YAML::Clone(Node *__return_storage_ptr__,Node *node)

{
  NodeEvents events;
  NodeBuilder builder;
  NodeEvents local_c0;
  NodeBuilder local_78;
  
  NodeEvents::NodeEvents(&local_c0,node);
  NodeBuilder::NodeBuilder(&local_78);
  NodeEvents::Emit(&local_c0,&local_78.super_EventHandler);
  NodeBuilder::Root(__return_storage_ptr__,&local_78);
  NodeBuilder::~NodeBuilder(&local_78);
  NodeEvents::~NodeEvents(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Node Clone(const Node& node) {
  NodeEvents events(node);
  NodeBuilder builder;
  events.Emit(builder);
  return builder.Root();
}